

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O0

int Wlc_NtkCollectObjs_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vObjs)

{
  int iVar1;
  Wlc_Obj_t *pObj_00;
  undefined4 local_34;
  int Count;
  int iFanin;
  int i;
  Vec_Int_t *vObjs_local;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  local_34 = 0;
  iVar1 = Wlc_ObjIsCi(pObj);
  if (iVar1 == 0) {
    if ((*(ushort *)pObj >> 7 & 1) == 0) {
      *(ushort *)pObj = *(ushort *)pObj & 0xff7f | 0x80;
      for (Count = 0; iVar1 = Wlc_ObjFaninNum(pObj), Count < iVar1; Count = Count + 1) {
        iVar1 = Wlc_ObjFaninId(pObj,Count);
        pObj_00 = Wlc_NtkObj(p,iVar1);
        iVar1 = Wlc_NtkCollectObjs_rec(p,pObj_00,vObjs);
        local_34 = iVar1 + local_34;
      }
      iVar1 = Wlc_ObjId(p,pObj);
      Vec_IntPush(vObjs,iVar1);
      p_local._4_4_ =
           local_34 +
           (uint)((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
                 (undefined1  [24])0x2d);
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Wlc_NtkCollectObjs_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vObjs )
{
    int i, iFanin, Count = 0;
    if ( Wlc_ObjIsCi(pObj) )
        return 0;
    if ( pObj->Mark )
        return 0;
    pObj->Mark = 1;
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Count += Wlc_NtkCollectObjs_rec( p, Wlc_NtkObj(p, iFanin), vObjs );
    Vec_IntPush( vObjs, Wlc_ObjId(p, pObj) );
    return Count + (int)(pObj->Type == WLC_OBJ_ARI_MULTI);
}